

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_data_segment_info(data_segment sec)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  data_pointer paVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  paVar4 = sec.data_segment_addr;
  for (uVar5 = 0; uVar5 != (sec._0_8_ & 0xffffffff); uVar5 = uVar5 + 1) {
    printf("  - data[%d] memory=0 offset=%lu count=%lu: \n",uVar5,(ulong)*paVar4[uVar5].offset.arg);
    uVar6 = 0;
    for (uVar2 = 0; lVar8 = 8, uVar2 <= paVar4[uVar5].init_data_count >> 3; uVar2 = uVar2 + 1) {
      uVar7 = (ulong)uVar6;
      printf("    ");
      uVar3 = uVar7;
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        if (uVar3 < paVar4[uVar5].init_data_count) {
          printf("%02x ",(ulong)paVar4[uVar5].init_data[uVar3]);
        }
        else {
          printf("   ");
        }
        uVar3 = uVar3 + 1;
      }
      printf("-> [");
      lVar8 = 8;
      for (; (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9 &&
             (uVar7 < paVar4[uVar5].init_data_count)); uVar7 = uVar7 + 1) {
        bVar1 = paVar4[uVar5].init_data[uVar7];
        if (0x5e < (byte)(bVar1 - 0x20)) {
          bVar1 = 0x20;
        }
        putchar((uint)bVar1);
      }
      puts("]");
      uVar6 = uVar6 + 8;
    }
  }
  return;
}

Assistant:

void print_data_segment_info(data_segment sec) {
    data_pointer dp;
    uint64 offset;
    for (int i = 0; i < sec.data_segment_count; ++i) {
        dp = sec.data_segment_addr + i;
        offset = *(uint32 *) (dp->offset.arg);
        printf("  - data[%d] memory=0 offset=%lu count=%lu: \n", i, offset, dp->init_data_count);
        for (int j = 0; j <= dp->init_data_count / 8; ++j) {
            printf("    ");
            for (int k = 0; k < 8; ++k) {
                uint64 index = j * 8 + k;
                if (index < dp->init_data_count) printf("%02x ", *(dp->init_data + index)); else printf("   ");
            }
            printf("-> [");
            for (int k = 0; k < 8; ++k) {
                uint64 index = j * 8 + k;
                if (index < dp->init_data_count) printf("%c", toPrintAble(*(dp->init_data + index))); else break;
            }
            printf("]\n");
        }
    }
}